

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

boolean find_offensive(monst *mtmp,musable *m)

{
  short sVar1;
  obj *poVar2;
  boolean bVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  obj *poVar7;
  bool bVar8;
  bool bVar9;
  
  bVar3 = lined_up(mtmp);
  bVar8 = true;
  if ((youmonst.data == mons + 0x94 || youmonst.data == mons + 0x9d) ||
      u.uprops[0x2a].extrinsic != 0) {
    uVar5 = mt_random();
    bVar8 = (uVar5 & 1) == 0;
  }
  poVar7 = which_armor(mtmp,4);
  m->offensive = (obj *)0x0;
  m->has_offense = MUSE_NONE;
  if ((((mtmp->field_0x62 & 0x40) == 0) && ((mtmp->data->mflags1 & 0x52000) == 0)) &&
     ((u._1052_1_ & 1) == 0)) {
    bVar9 = false;
    bVar4 = in_your_sanctuary(mtmp,'\0','\0');
    if (bVar4 == '\0') {
      bVar4 = dmgtype(mtmp->data,0x1b);
      bVar9 = false;
      if ((((((uarmg != (obj *)0x0 || uarms != (obj *)0x0) || uarmc != (obj *)0x0) ||
            ((uarmh != (obj *)0x0 || uarm != (obj *)0x0) ||
            (uarmu != (obj *)0x0 || uwep != (obj *)0x0))) || uarmf != (obj *)0x0) || bVar4 == '\0')
         && (bVar3 != '\0')) {
        for (poVar2 = mtmp->minvent; poVar2 != (obj *)0x0; poVar2 = poVar2->nobj) {
          if (bVar8) {
            sVar1 = poVar2->otyp;
            if ((sVar1 == 0x1d4) && ('\0' < poVar2->spe)) {
              m->offensive = poVar2;
              m->has_offense = MUSE_WAN_DEATH;
            }
            if (m->has_offense != MUSE_WAN_SLEEP) {
              if (((sVar1 == 0x1d3) && ('\0' < poVar2->spe)) && (-1 < multi)) {
                m->offensive = poVar2;
                m->has_offense = MUSE_WAN_SLEEP;
              }
              if (m->has_offense != MUSE_WAN_FIRE) {
                if ((sVar1 == 0x1d1) && ('\0' < poVar2->spe)) {
                  m->offensive = poVar2;
                  m->has_offense = MUSE_WAN_FIRE;
                }
                if (m->has_offense != MUSE_FIRE_HORN) {
                  if ((sVar1 == 0x100) && ('\0' < poVar2->spe)) {
                    m->offensive = poVar2;
                    m->has_offense = MUSE_FIRE_HORN;
                  }
                  if (m->has_offense != MUSE_WAN_COLD) {
                    if ((sVar1 == 0x1d2) && ('\0' < poVar2->spe)) {
                      m->offensive = poVar2;
                      m->has_offense = MUSE_WAN_COLD;
                    }
                    if (m->has_offense != MUSE_FROST_HORN) {
                      if ((sVar1 == 0xff) && ('\0' < poVar2->spe)) {
                        m->offensive = poVar2;
                        m->has_offense = MUSE_FROST_HORN;
                      }
                      if (m->has_offense != MUSE_WAN_LIGHTNING) {
                        if ((sVar1 == 0x1d5) && ('\0' < poVar2->spe)) {
                          m->offensive = poVar2;
                          m->has_offense = MUSE_WAN_LIGHTNING;
                        }
                        if (m->has_offense != MUSE_WAN_MAGIC_MISSILE) {
                          if ((sVar1 == 0x1d0) && ('\0' < poVar2->spe)) {
                            m->offensive = poVar2;
                            m->has_offense = MUSE_WAN_MAGIC_MISSILE;
                          }
                          goto LAB_001fa1cf;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
LAB_001fa1cf:
            if (m->has_offense != MUSE_WAN_STRIKING) {
              sVar1 = poVar2->otyp;
              if ((sVar1 == 0x1c4) && ('\0' < poVar2->spe)) {
                m->offensive = poVar2;
                m->has_offense = MUSE_WAN_STRIKING;
              }
              if (m->has_offense != MUSE_WAN_CANCELLATION) {
                if ((sVar1 == 0x1ca) && ('\0' < poVar2->spe)) {
                  m->offensive = poVar2;
                  m->has_offense = MUSE_WAN_CANCELLATION;
                }
                if (m->has_offense != MUSE_POT_PARALYSIS) {
                  if ((sVar1 == 0x12e) && (-1 < multi)) {
                    m->offensive = poVar2;
                    m->has_offense = MUSE_POT_PARALYSIS;
                  }
                  if (m->has_offense != MUSE_POT_BLINDNESS) {
                    if ((sVar1 == 0x133) && (bVar3 = attacktype(mtmp->data,0xf), bVar3 == '\0')) {
                      m->offensive = poVar2;
                      m->has_offense = MUSE_POT_BLINDNESS;
                    }
                    if (m->has_offense != MUSE_POT_CONFUSION) {
                      sVar1 = poVar2->otyp;
                      if (sVar1 == 0x12d) {
                        m->offensive = poVar2;
                        m->has_offense = MUSE_POT_CONFUSION;
                      }
                      if (m->has_offense != MUSE_POT_SLEEPING) {
                        if (sVar1 == 0x13d) {
                          m->offensive = poVar2;
                          m->has_offense = MUSE_POT_SLEEPING;
                        }
                        if (m->has_offense != MUSE_POT_ACID) {
                          if (sVar1 == 0x141) {
                            m->offensive = poVar2;
                            m->has_offense = MUSE_POT_ACID;
                          }
                          if ((sVar1 == 0x163) && (m->has_offense != MUSE_SCR_EARTH)) {
                            if (((poVar7 == (obj *)0x0) ||
                                (6 < (ushort)((*(ushort *)&objects[poVar7->otyp].field_0x11 >> 4 &
                                              0x1f) - 0xb))) && ((mtmp->field_0x62 & 0x20) == 0)) {
                              uVar5 = mtmp->data->mflags1;
                              if (((((uVar5 & 0xc) == 0) && ((uVar5 >> 0x14 & 1) == 0)) &&
                                  (mtmp->data->mlet != '6')) &&
                                 (uVar5 = mt_random(),
                                 0x19999999 <
                                 (uVar5 * -0x33333333 >> 1 |
                                 (uint)((uVar5 * -0x33333333 & 1) != 0) << 0x1f)))
                              goto LAB_001fa2a1;
                            }
                            iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)mtmp->mux,(int)mtmp->muy)
                            ;
                            if ((((iVar6 < 3) && ((mtmp->field_0x62 & 2) != 0)) &&
                                (((mtmp->data->mflags1 & 0x1000) == 0 &&
                                 (bVar3 = on_level(&u.uz,&dungeon_topology.d_rogue_level),
                                 bVar3 == '\0')))) &&
                               ((u.uz.dnum != dungeon_topology.d_astral_level.dnum ||
                                (bVar3 = on_level(&u.uz,&dungeon_topology.d_earth_level),
                                bVar3 != '\0')))) {
                              m->offensive = poVar2;
                              m->has_offense = MUSE_SCR_EARTH;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_001fa2a1:
        }
        bVar9 = m->has_offense != MUSE_NONE;
      }
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

boolean find_offensive(struct monst *mtmp, struct musable *m)
{
	struct obj *obj;
	boolean ranged_stuff = lined_up(mtmp);
	boolean reflection_skip = (Reflecting && rn2(2));
	struct obj *helmet = which_armor(mtmp, W_ARMH);

	m->offensive = NULL;
	m->has_offense = 0;
	if (mtmp->mpeaceful || is_animal(mtmp->data) ||
				mindless(mtmp->data) || nohands(mtmp->data))
		return FALSE;
	if (u.uswallow) return FALSE;
	if (in_your_sanctuary(mtmp, 0, 0)) return FALSE;
	if (dmgtype(mtmp->data, AD_HEAL) && !uwep && !uarmu
	    && !uarm && !uarmh && !uarms && !uarmg && !uarmc && !uarmf)
		return FALSE;

	if (!ranged_stuff) return FALSE;
#define nomore(x) if (m->has_offense==x) continue;
	for (obj=mtmp->minvent; obj; obj=obj->nobj) {
		/* nomore(MUSE_WAN_DEATH); */
		if (!reflection_skip) {
		    if (obj->otyp == WAN_DEATH && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_DEATH;
		    }
		    nomore(MUSE_WAN_SLEEP);
		    if (obj->otyp == WAN_SLEEP && obj->spe > 0 && multi >= 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_SLEEP;
		    }
		    nomore(MUSE_WAN_FIRE);
		    if (obj->otyp == WAN_FIRE && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_FIRE;
		    }
		    nomore(MUSE_FIRE_HORN);
		    if (obj->otyp == FIRE_HORN && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_FIRE_HORN;
		    }
		    nomore(MUSE_WAN_COLD);
		    if (obj->otyp == WAN_COLD && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_COLD;
		    }
		    nomore(MUSE_FROST_HORN);
		    if (obj->otyp == FROST_HORN && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_FROST_HORN;
		    }
		    nomore(MUSE_WAN_LIGHTNING);
		    if (obj->otyp == WAN_LIGHTNING && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_LIGHTNING;
		    }
		    nomore(MUSE_WAN_MAGIC_MISSILE);
		    if (obj->otyp == WAN_MAGIC_MISSILE && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_MAGIC_MISSILE;
		    }
		}
		nomore(MUSE_WAN_STRIKING);
		if (obj->otyp == WAN_STRIKING && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_STRIKING;
		}
		nomore(MUSE_WAN_CANCELLATION);
		if (obj->otyp == WAN_CANCELLATION && obj->spe > 0) {
			m->offensive = obj;
			m->has_offense = MUSE_WAN_CANCELLATION;
		}
		nomore(MUSE_POT_PARALYSIS);
		if (obj->otyp == POT_PARALYSIS && multi >= 0) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_PARALYSIS;
		}
		nomore(MUSE_POT_BLINDNESS);
		if (obj->otyp == POT_BLINDNESS && !attacktype(mtmp->data, AT_GAZE)) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_BLINDNESS;
		}
		nomore(MUSE_POT_CONFUSION);
		if (obj->otyp == POT_CONFUSION) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_CONFUSION;
		}
		nomore(MUSE_POT_SLEEPING);
		if (obj->otyp == POT_SLEEPING) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_SLEEPING;
		}
		nomore(MUSE_POT_ACID);
		if (obj->otyp == POT_ACID) {
			m->offensive = obj;
			m->has_offense = MUSE_POT_ACID;
		}
		/* we can safely put this scroll here since the locations that
		 * are in a 1 square radius are a subset of the locations that
		 * are in wand range
		 */
		nomore(MUSE_SCR_EARTH);
		if (obj->otyp == SCR_EARTH
		       && ((helmet && is_metallic(helmet)) ||
				mtmp->mconf || amorphous(mtmp->data) ||
				passes_walls(mtmp->data) ||
				noncorporeal(mtmp->data) ||
				unsolid(mtmp->data) || !rn2(10))
		       && dist2(mtmp->mx,mtmp->my,mtmp->mux,mtmp->muy) <= 2
		       && mtmp->mcansee && haseyes(mtmp->data)
		       && !Is_rogue_level(&u.uz)
		       && (!In_endgame(&u.uz) || Is_earthlevel(&u.uz))) {
		    m->offensive = obj;
		    m->has_offense = MUSE_SCR_EARTH;
		}
	}
	return (boolean)(!!m->has_offense);
#undef nomore
}